

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_region_transaction_commit_arm(MemoryRegion *mr)

{
  uc_struct_conflict1 *uc;
  AddressSpace *pAVar1;
  MemoryListener *pMVar2;
  uc_struct_conflict7 *puVar3;
  MemoryRegion *mr_00;
  gpointer pvVar4;
  anon_union_16_2_aaf24f3d_for_link *paVar5;
  anon_union_16_2_aaf24f3d_for_address_spaces_link *paVar6;
  
  uc = (uc_struct_conflict1 *)mr->uc;
  if (uc->memory_region_update_pending == true) {
    if (uc->flat_views != (GHashTable *)0x0) {
      g_hash_table_destroy(uc->flat_views);
      uc->flat_views = (GHashTable *)0x0;
    }
    flatviews_init(uc);
    paVar6 = (anon_union_16_2_aaf24f3d_for_address_spaces_link *)&uc->address_spaces;
    while (pAVar1 = paVar6->tqe_next, pAVar1 != (AddressSpace *)0x0) {
      mr_00 = memory_region_get_flatview_root((MemoryRegion *)pAVar1->root);
      pvVar4 = g_hash_table_lookup(uc->flat_views,mr_00);
      if (pvVar4 == (gpointer)0x0) {
        generate_memory_topology(uc,mr_00);
      }
      paVar6 = &pAVar1->address_spaces_link;
    }
    paVar5 = (anon_union_16_2_aaf24f3d_for_link *)&mr->uc->memory_listeners;
    while (pMVar2 = paVar5->tqe_next, pMVar2 != (MemoryListener *)0x0) {
      if (pMVar2->begin != (_func_void_MemoryListener_ptr *)0x0) {
        (*pMVar2->begin)(pMVar2);
      }
      paVar5 = &pMVar2->link;
    }
    paVar6 = (anon_union_16_2_aaf24f3d_for_address_spaces_link *)&mr->uc->address_spaces;
    while (pAVar1 = paVar6->tqe_next, pAVar1 != (AddressSpace *)0x0) {
      address_space_set_flatview(pAVar1);
      paVar6 = &pAVar1->address_spaces_link;
    }
    puVar3 = mr->uc;
    puVar3->memory_region_update_pending = false;
    paVar5 = (anon_union_16_2_aaf24f3d_for_link *)&puVar3->memory_listeners;
    while (pMVar2 = paVar5->tqe_next, pMVar2 != (MemoryListener *)0x0) {
      if (pMVar2->commit != (_func_void_MemoryListener_ptr *)0x0) {
        (*pMVar2->commit)(pMVar2);
      }
      paVar5 = &pMVar2->link;
    }
  }
  return;
}

Assistant:

void memory_region_transaction_commit(MemoryRegion *mr)
{
    AddressSpace *as;

    if (mr->uc->memory_region_update_pending) {
        flatviews_reset(mr->uc);

        MEMORY_LISTENER_CALL_GLOBAL(mr->uc, begin, Forward);

        QTAILQ_FOREACH(as, &mr->uc->address_spaces, address_spaces_link) {
            address_space_set_flatview(as);
        }
        mr->uc->memory_region_update_pending = false;
        MEMORY_LISTENER_CALL_GLOBAL(mr->uc, commit, Forward);
    }
}